

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::adjustInheritedFields
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *obj,bool override_da,
          string *from_default_da,bool override_q,int from_default_q)

{
  bool bVar1;
  int iVar2;
  string *key;
  string *key_00;
  string da;
  QPDFFormFieldObjectHelper cur_field;
  allocator<char> local_c9;
  _Alloc_hider in_stack_ffffffffffffff38;
  QPDFObjectHandle local_a8;
  string local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFFormFieldObjectHelper local_68;
  
  if (override_da || override_q) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)obj);
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,(QPDFObjectHandle *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    if (override_da) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff38,"/DA",(allocator<char> *)&local_98);
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_68,
                         (QPDFFormFieldObjectHelper *)&stack0xffffffffffffff38,key);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      if (!bVar1) {
        QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
                  ((string *)&stack0xffffffffffffff38,&local_68);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&stack0xffffffffffffff38,from_default_da);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"/DA",&local_c9);
          QPDFObjectHandle::newUnicodeString(&local_a8,from_default_da);
          QPDFObjectHandle::replaceKey(obj,&local_98,&local_a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&local_98);
        }
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      }
    }
    if (override_q) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff38,"/Q",(allocator<char> *)&local_98);
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_68,
                         (QPDFFormFieldObjectHelper *)&stack0xffffffffffffff38,key_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      if (!bVar1) {
        iVar2 = QPDFFormFieldObjectHelper::getQuadding(&local_68);
        if (iVar2 != from_default_q) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xffffffffffffff38,"/Q",(allocator<char> *)&local_a8);
          QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff38._M_p);
          QPDFObjectHandle::replaceKey
                    (obj,(string *)&stack0xffffffffffffff38,(QPDFObjectHandle *)&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
        }
      }
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustInheritedFields(
    QPDFObjectHandle obj,
    bool override_da,
    std::string const& from_default_da,
    bool override_q,
    int from_default_q)
{
    // Override /Q or /DA if needed. If this object has a field type, directly or inherited, it is a
    // field and not just an annotation. In that case, we need to override if we are getting a value
    // from the document that is different from the value we would have gotten from the old
    // document. We must take care not to override an explicit value. It's possible that /FT may be
    // inherited by lower fields that may explicitly set /DA or /Q or that this is a field whose
    // type does not require /DA or /Q and we may be put a value on the field that is unused. This
    // is harmless, so it's not worth trying to work around.

    auto has_explicit = [](QPDFFormFieldObjectHelper& field, std::string const& key) {
        if (field.getObjectHandle().hasKey(key)) {
            return true;
        }
        auto oh = field.getInheritableFieldValue(key);
        if (!oh.isNull()) {
            return true;
        }
        return false;
    };

    if (override_da || override_q) {
        QPDFFormFieldObjectHelper cur_field(obj);
        if (override_da && (!has_explicit(cur_field, "/DA"))) {
            std::string da = cur_field.getDefaultAppearance();
            if (da != from_default_da) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override da");
                obj.replaceKey("/DA", QPDFObjectHandle::newUnicodeString(from_default_da));
            }
        }
        if (override_q && (!has_explicit(cur_field, "/Q"))) {
            int q = cur_field.getQuadding();
            if (q != from_default_q) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override q");
                obj.replaceKey("/Q", QPDFObjectHandle::newInteger(from_default_q));
            }
        }
    }
}